

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

AssertionResult __thiscall
testing::internal::CmpHelperEQ<char[5],fmt::v5::basic_string_view<char>>
          (internal *this,char *expected_expression,char *actual_expression,char (*expected) [5],
          basic_string_view<char> *actual)

{
  bool bVar1;
  size_t sVar2;
  char *value;
  basic_string_view<char> *value_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  AssertionResult AVar4;
  basic_string_view<char> lhs;
  string sStack_68;
  string local_48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar3
  ;
  
  sVar2 = strlen(*expected);
  lhs.size_ = sVar2;
  lhs.data_ = *expected;
  bVar1 = fmt::v5::operator==(lhs,*actual);
  if (bVar1) {
    AVar4 = AssertionSuccess();
    sVar3 = AVar4.message_.ptr_;
  }
  else {
    FormatForComparison<char_const*,fmt::v5::basic_string_view<char>>::Format_abi_cxx11_
              (&local_48,
               (FormatForComparison<char_const*,fmt::v5::basic_string_view<char>> *)expected,value);
    PrintToString<fmt::v5::basic_string_view<char>>(&sStack_68,(testing *)actual,value_00);
    EqFailure(this,expected_expression,actual_expression,&local_48,&sStack_68,false);
    std::__cxx11::string::~string((string *)&sStack_68);
    std::__cxx11::string::~string((string *)&local_48);
    sVar3.ptr_ = extraout_RDX;
  }
  AVar4.message_.ptr_ = sVar3.ptr_;
  AVar4._0_8_ = this;
  return AVar4;
}

Assistant:

AssertionResult CmpHelperEQ(const char* expected_expression,
                            const char* actual_expression,
                            const T1& expected,
                            const T2& actual) {
#ifdef _MSC_VER
# pragma warning(push)          // Saves the current warning state.
# pragma warning(disable:4389)  // Temporarily disables warning on
                                // signed/unsigned mismatch.
#endif

  if (expected == actual) {
    return AssertionSuccess();
  }

#ifdef _MSC_VER
# pragma warning(pop)          // Restores the warning state.
#endif

  return EqFailure(expected_expression,
                   actual_expression,
                   FormatForComparisonFailureMessage(expected, actual),
                   FormatForComparisonFailureMessage(actual, expected),
                   false);
}